

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O3

void __thiscall
helics::MultiBroker::addRoute(MultiBroker *this,route_id rid,int interfaceId,string_view routeInfo)

{
  pointer puVar1;
  CommsInterface *this_00;
  route_id local_14;
  int local_10 [2];
  
  local_14.rid = rid.rid;
  local_10[0] = interfaceId;
  if (interfaceId < 1) {
    this_00 = (this->masterComm)._M_t.
              super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
              .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    if (this_00 != (CommsInterface *)0x0) {
      CommsInterface::addRoute(this_00,rid,routeInfo);
      local_10[1] = 0;
      std::vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>::
      emplace_back<helics::route_id&,int>
                ((vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>
                  *)&this->routingTable,&local_14,local_10 + 1);
    }
  }
  else {
    puVar1 = (this->comms).
             super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (interfaceId <=
        (int)((ulong)((long)(this->comms).
                            super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3)) {
      CommsInterface::addRoute
                ((CommsInterface *)
                 puVar1[(ulong)(uint)interfaceId - 1]._M_t.
                 super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                 ._M_t,rid,routeInfo);
      std::vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>::
      emplace_back<helics::route_id&,int&>
                ((vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>
                  *)&this->routingTable,&local_14,local_10);
    }
  }
  return;
}

Assistant:

void MultiBroker::addRoute(route_id rid, int interfaceId, std::string_view routeInfo)
{
    if (interfaceId <= 0) {
        if (masterComm) {
            masterComm->addRoute(rid, routeInfo);
            routingTable.emplace_back(rid, 0);
        }
    } else {
        if (isValidIndex(interfaceId - 1, comms)) {
            comms[interfaceId - 1]->addRoute(rid, routeInfo);
            routingTable.emplace_back(rid, interfaceId);
        }
    }
}